

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_duplicate_set.c
# Opt level: O0

void oonf_duplicate_set_add(oonf_duplicate_set *set,oonf_dupset_type type)

{
  oonf_dupset_type type_local;
  oonf_duplicate_set *set_local;
  
  memset(set,0,0x40);
  avl_init(&set->_tree,_avl_cmp_dupkey,false);
  if (type != OONF_DUPSET_64BIT) {
    set->_mask = _mask_values[type];
    set->_offset = set->_mask + 1;
    set->_limit = set->_mask / 2;
  }
  return;
}

Assistant:

void
oonf_duplicate_set_add(struct oonf_duplicate_set *set, enum oonf_dupset_type type) {
  memset(set, 0, sizeof(*set));
  avl_init(&set->_tree, _avl_cmp_dupkey, false);

  if (type != OONF_DUPSET_64BIT) {
    set->_mask = _mask_values[type];
    set->_offset = set->_mask + 1;
    set->_limit = set->_mask / 2;
  }
}